

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
          *samples)

{
  pointer pRVar1;
  pointer pRVar2;
  ulong uVar3;
  SampleBuilder *pSVar4;
  ulong uVar5;
  offset_in_SampleType_to_deUint64 in_RCX;
  deUint64 *pdVar6;
  int *piVar7;
  string *psVar8;
  LogNumber<float> *pLVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  long lVar10;
  long lVar11;
  int __fd;
  ulong uVar12;
  ulong in_R9;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float xmin;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float xmax;
  float xmax_00;
  float fVar23;
  float fVar24;
  RenderSampleAnalyzeResult RVar25;
  allocator<char> local_ade;
  allocator<char> local_add;
  allocator<char> local_adc;
  allocator<char> local_adb;
  allocator<char> local_ada;
  allocator<char> local_ad9;
  float local_ad8;
  allocator<char> local_ad2;
  allocator<char> local_ad1;
  allocator<char> local_ad0;
  allocator<char> local_acf;
  allocator<char> local_ace;
  allocator<char> local_acd;
  allocator<char> local_acc;
  allocator<char> local_acb;
  allocator<char> local_aca;
  allocator<char> local_ac9;
  allocator<char> local_ac8;
  allocator<char> local_ac7;
  allocator<char> local_ac6;
  allocator<char> local_ac5;
  allocator<char> local_ac4;
  allocator<char> local_ac3;
  allocator<char> local_ac2;
  allocator<char> local_ac1;
  allocator<char> local_ac0;
  allocator<char> local_abf;
  allocator<char> local_abe;
  allocator<char> local_abd;
  allocator<char> local_abc;
  allocator<char> local_abb;
  allocator<char> local_aba;
  allocator<char> local_ab9;
  allocator<char> local_ab8;
  allocator<char> local_ab7;
  allocator<char> local_ab6;
  allocator<char> local_ab5;
  LineParametersWithConfidence theilSenFitting;
  LineParametersWithConfidence contributionFitting;
  vector<float,_std::allocator<float>_> processingRates;
  ScopedLogSection section_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  ScopedLogSection section_1;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  LogNumber<float> local_718;
  LogNumber<float> local_6b0;
  ScopedLogSection section;
  LogNumber<float> local_628;
  LogNumber<float> local_5c0;
  LogNumber<float> local_558;
  LogNumber<float> local_4f0;
  LogNumber<float> local_488;
  LogNumber<float> local_420;
  LogNumber<float> local_3b8;
  LogNumber<float> local_350;
  StatsType resultStats;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x20,in_RCX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x38,
             (allocator_type *)&processingRates);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  pdVar6 = &(pRVar1->duration).fitResponseDuration;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12] = *pdVar6;
    pdVar6 = pdVar6 + 7;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,uVar3,(allocator_type *)&local_718);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  piVar7 = &pRVar1->renderDataSize;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar3 < 0) {
      in_R9 = uVar3 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)*piVar7 / (((float)uVar3 / 1000.0) / 1000.0);
    piVar7 = piVar7 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.medianRate =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_718);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  piVar7 = &pRVar1->renderDataSize;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar3 < 0) {
      in_R9 = uVar3 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)uVar3 - ((float)*piVar7 * theilSenFitting.coefficient + theilSenFitting.offset);
    piVar7 = piVar7 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.maxDiff9DecileTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_718);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  piVar7 = &pRVar1->renderDataSize;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    fVar15 = (float)*piVar7 * theilSenFitting.coefficient + theilSenFitting.offset;
    fVar21 = 0.0;
    if (1.0 <= fVar15) {
      uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      if ((long)uVar3 < 0) {
        in_R9 = uVar3 >> 1;
      }
      fVar21 = ((float)uVar3 - fVar15) / fVar15;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) = fVar21;
    piVar7 = piVar7 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxRelDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.max9DecileRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar5 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = uVar5;
  if ((long)uVar5 < 0) {
    uVar3 = (ulong)((uint)uVar5 & 1) | uVar5 >> 1;
  }
  resultStats.result.minTime = (float)uVar5;
  uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if ((long)uVar5 < 0) {
    uVar3 = uVar5 >> 1;
  }
  resultStats.result.maxTime = (float)uVar5;
  resultStats.result.medianTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  resultStats.result.min2DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  resultStats.result.max9DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&resultStats.render,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x0,uVar3);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&resultStats.read,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x8,uVar3);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&resultStats.total,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x18,uVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Samples",(allocator<char> *)&local_718);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Samples",(allocator<char> *)&local_6b0);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Samples",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"Samples",(allocator<char> *)&local_b8);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_488,&local_4f0.m_name,&local_558.m_name)
  ;
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_488,__fd,__buf,(size_t)psVar8);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"DataSize",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"Data processed",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"bytes",(allocator<char> *)&local_118);
  psVar8 = (string *)&contributionFitting;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&values,&local_5c0.m_name,&local_628.m_name,psVar8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&values,__fd,__buf_00,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"VertexCount",(allocator<char> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"Number of vertices",(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"vertices",(allocator<char> *)&local_178);
  psVar8 = &local_888;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&processingRates,(string *)&section_1,&local_868,psVar8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&processingRates,__fd,__buf_01,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"UnrelatedUploadSize",(allocator<char> *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"Unrelated upload size",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"bytes",(allocator<char> *)&local_1d8);
  psVar8 = &local_8e8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_718,&local_8a8,&local_8c8,psVar8,QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&local_718,__fd,__buf_02,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"TotalTime",(allocator<char> *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,"Total time",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"us",(allocator<char> *)&local_238);
  psVar8 = &local_948;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6b0,&local_908,&local_928,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_6b0,__fd,__buf_03,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"DrawCallTime",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"Draw call time",(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"us",(allocator<char> *)&section_2);
  psVar8 = &local_758;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_350,&local_968,&local_738,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_350,__fd,__buf_04,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"ReadTime",&local_ad9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"ReadPixels time",&local_ada);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"us",&local_adb);
  psVar8 = &local_7b8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_3b8,&local_778,&local_798,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_3b8,__fd,__buf_05,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"FitResidual",&local_adc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"Fit residual",&local_add)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"us",&local_ade);
  psVar8 = &local_818;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_420,&local_7d8,&local_7f8,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_420,__fd,__buf_06,(size_t)psVar8);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_420);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_778);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_350);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_968);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_718);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&processingRates);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section_1);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&values);
  std::__cxx11::string::~string((string *)&contributionFitting);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_5c0);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_488);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_4f0);
  lVar11 = 0;
  for (lVar10 = 0;
      pRVar1 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar10 < (int)(((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38);
      lVar10 = lVar10 + 1) {
    local_ad8 = (float)*(ulong *)((long)&(pRVar1->duration).fitResponseDuration + lVar11);
    fVar15 = (float)*(int *)((long)&pRVar1->renderDataSize + lVar11) * theilSenFitting.coefficient +
             theilSenFitting.offset;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._8_16_ = ZEXT416(0);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    pSVar4 = tcu::SampleBuilder::operator<<
                       ((SampleBuilder *)&values,*(int *)((long)&pRVar1->renderDataSize + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               numVertices + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               unrelatedDataSize + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderReadDuration + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderDuration + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).readDuration + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<(pSVar4,local_ad8 - fVar15);
    tcu::SampleBuilder::operator<<(pSVar4,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    lVar11 = lVar11 + 0x38;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Contribution",(allocator<char> *)&local_718);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Contributions",(allocator<char> *)&local_6b0);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"DrawCallConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"DrawCall: Approximated contant cost",
             (allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_3b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_6b0.m_name,&local_350.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_07,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"DrawCallLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"DrawCall: Approximated linear cost",(allocator<char> *)&local_8e8
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_4f0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_420.m_name,&local_488.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_08,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"DrawCallMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"DrawCall: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_628;
  tcu::LogNumber<float>::LogNumber
            (&local_718,&local_558.m_name,&local_5c0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.render.medianTime);
  tcu::LogNumber<float>::write(&local_718,__fd,__buf_09,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_718);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_558);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_420);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_6b0);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"ReadConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"Read: Approximated contant cost",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_3b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_6b0.m_name,&local_350.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_10,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"ReadLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"Read: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_4f0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_420.m_name,&local_488.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_11,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"ReadMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"Read: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_628;
  tcu::LogNumber<float>::LogNumber
            (&local_718,&local_558.m_name,&local_5c0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.read.medianTime);
  tcu::LogNumber<float>::write(&local_718,__fd,__buf_12,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_718);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_558);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_420);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_6b0);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x18,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"TotalConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"Total: Approximated contant cost",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_3b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_6b0.m_name,&local_350.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_13,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"TotalLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"Total: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_4f0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_420.m_name,&local_488.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_14,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"TotalMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"Total: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_628;
  tcu::LogNumber<float>::LogNumber
            (&local_718,&local_558.m_name,&local_5c0.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.total.medianTime);
  tcu::LogNumber<float>::write(&local_718,__fd,__buf_15,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_718);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_558);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_420);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_6b0);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Results",(allocator<char> *)&local_718);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Results",(allocator<char> *)&local_6b0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&values,(string *)&processingRates);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_ad8 = (float)((pRVar2[-1].renderDataSize + pRVar1->renderDataSize) / 2);
  fVar22 = theilSenFitting.coefficient * local_ad8;
  fVar16 = theilSenFitting.offset + fVar22;
  uVar5 = ((long)pRVar2 - (long)pRVar1) / 0x38;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 2;
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&values,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)0x0,(int)uVar5,0x20,in_R9);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&processingRates,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
              *)(uVar5 & 0xffffffff),
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38),0x20,in_R9);
  fVar15 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar17 = (float)pRVar1->renderDataSize;
  fVar21 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  xmax = (float)pRVar2[-1].renderDataSize;
  local_48 = ZEXT416((uint)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_);
  local_58 = ZEXT416((uint)processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_);
  fVar18 = getAreaBetweenLines(fVar17,xmax,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
            ((LineParametersWithConfidence *)&values,samples,0,
             (int)(((long)pRVar2 - (long)pRVar1) / 0x38),2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
            ((LineParametersWithConfidence *)&processingRates,samples,1,
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38),2,0x20);
  xmin = (float)((samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  fVar24 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  xmax_00 = (float)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_68 = ZEXT416((uint)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_);
  local_78 = ZEXT416((uint)processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_);
  fVar19 = getAreaBetweenLines(xmin,xmax_00,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"ResultLinearity",&local_ad9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Sample linearity",&local_ada);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"%",&local_adb);
  fVar20 = (float)local_48._0_4_ * fVar17 + fVar21;
  fVar23 = (float)local_58._0_4_ * fVar17 + fVar15;
  uVar13 = -(uint)(fVar20 <= fVar23);
  fVar21 = (float)local_48._0_4_ * xmax + fVar21;
  fVar15 = (float)local_58._0_4_ * xmax + fVar15;
  uVar14 = -(uint)(fVar15 <= fVar21);
  fVar15 = ((float)(~uVar14 & (uint)fVar15 | (uint)fVar21 & uVar14) -
           (float)(~uVar13 & (uint)fVar23 | (uint)fVar20 & uVar13)) * (xmax - fVar17);
  fVar21 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - fVar18 / fVar15));
  fVar15 = 1.0;
  if (fVar21 <= 1.0) {
    fVar15 = fVar21;
  }
  psVar8 = &local_868;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,(string *)&contributionFitting,(string *)&section_1,psVar8,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_16,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"SampleTemporalStability",&local_adc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"Sample temporal stability",&local_add);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"%",&local_ade);
  fVar15 = (float)local_68._0_4_ * xmin + fVar24;
  fVar21 = (float)local_78._0_4_ * xmin +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar13 = -(uint)(fVar15 <= fVar21);
  fVar24 = (float)local_68._0_4_ * xmax_00 + fVar24;
  fVar17 = (float)local_78._0_4_ * xmax_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar14 = -(uint)(fVar17 <= fVar24);
  fVar15 = ((float)(~uVar14 & (uint)fVar17 | (uint)fVar24 & uVar14) -
           (float)(~uVar13 & (uint)fVar21 | (uint)fVar15 & uVar13)) * (xmax_00 - xmin);
  fVar21 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - fVar19 / fVar15));
  fVar15 = 1.0;
  if (fVar21 <= 1.0) {
    fVar15 = fVar21;
  }
  psVar8 = &local_8c8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_888,&local_8a8,psVar8,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_17,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"ApproximatedConstantCost",&local_ab5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"Approximated contant cost",&local_ab6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"us",&local_ab7);
  psVar8 = &local_928;
  tcu::LogNumber<float>::LogNumber
            (&local_718,&local_8e8,&local_908,psVar8,QP_KEY_TAG_TIME,theilSenFitting.offset);
  tcu::LogNumber<float>::write(&local_718,__fd,__buf_18,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"ApproximatedConstantCostConfidence60Lower",&local_ab8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"Approximated contant cost 60% confidence lower limit",&local_ab9)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"us",&local_aba);
  psVar8 = &local_738;
  tcu::LogNumber<float>::LogNumber
            (&local_6b0,&local_948,&local_968,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_6b0,__fd,__buf_19,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"ApproximatedConstantCostConfidence60Upper",&local_abb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"Approximated contant cost 60% confidence upper limit",&local_abc)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"us",&local_abd);
  psVar8 = &local_798;
  tcu::LogNumber<float>::LogNumber
            (&local_350,&local_758,&local_778,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_350,__fd,__buf_20,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"ApproximatedLinearCost",&local_abe);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"Approximated linear cost",&local_abf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"us / MB",&local_ac0);
  psVar8 = &local_7f8;
  tcu::LogNumber<float>::LogNumber
            (&local_3b8,&local_7b8,&local_7d8,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_3b8,__fd,__buf_21,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"ApproximatedLinearCostConfidence60Lower",&local_ac1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"Approximated linear cost 60% confidence lower limit",&local_ac2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"us / MB",&local_ac3);
  psVar8 = &local_98;
  tcu::LogNumber<float>::LogNumber
            (&local_420,&local_818,(string *)&section,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_420,__fd,__buf_22,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"ApproximatedLinearCostConfidence60Upper",&local_ac4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Approximated linear cost 60% confidence upper limit",&local_ac5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"us / MB",&local_ac6);
  psVar8 = &local_f8;
  tcu::LogNumber<float>::LogNumber
            (&local_488,&local_b8,&local_d8,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_488,__fd,__buf_23,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"ApproximatedProcessRate",&local_ac7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Approximated processing rate",&local_ac8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"MB / s",&local_ac9);
  fVar15 = local_ad8 / ((fVar16 / 1000.0) / 1000.0);
  psVar8 = &local_158;
  tcu::LogNumber<float>::LogNumber
            (&local_4f0,&local_118,&local_138,psVar8,QP_KEY_TAG_PERFORMANCE,
             fVar15 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_4f0,__fd,__buf_24,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"ApproximatedProcessRateNoConstant",&local_aca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Approximated processing rate without constant cost",&local_acb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"MB / s",&local_acc);
  psVar8 = &local_1b8;
  tcu::LogNumber<float>::LogNumber
            (&local_558,&local_178,&local_198,psVar8,QP_KEY_TAG_PERFORMANCE,
             (local_ad8 / ((fVar22 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_558,__fd,__buf_25,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"SampleMedianTime",&local_acd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Median sample time",&local_ace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"us",&local_acf);
  psVar8 = &local_218;
  tcu::LogNumber<float>::LogNumber
            (&local_5c0,&local_1d8,&local_1f8,psVar8,QP_KEY_TAG_TIME,resultStats.result.medianTime);
  tcu::LogNumber<float>::write(&local_5c0,__fd,__buf_26,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"SampleMedianProcess",&local_ad0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Median processing rate",&local_ad1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"MB / s",&local_ad2);
  psVar8 = &local_278;
  tcu::LogNumber<float>::LogNumber
            (&local_628,&local_238,&local_258,psVar8,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_628,__fd,__buf_27,(size_t)psVar8);
  tcu::LogNumber<float>::~LogNumber(&local_628);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  tcu::LogNumber<float>::~LogNumber(&local_5c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  tcu::LogNumber<float>::~LogNumber(&local_558);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  tcu::LogNumber<float>::~LogNumber(&local_4f0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  tcu::LogNumber<float>::~LogNumber(&local_488);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  tcu::LogNumber<float>::~LogNumber(&local_420);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_818);
  tcu::LogNumber<float>::~LogNumber(&local_3b8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7b8);
  tcu::LogNumber<float>::~LogNumber(&local_350);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_758);
  tcu::LogNumber<float>::~LogNumber(&local_6b0);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  tcu::LogNumber<float>::~LogNumber(&local_718);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  RVar25.renderRateAtRange = fVar15;
  RVar25.renderRateMedian = resultStats.medianRate;
  RVar25.renderRateAtInfinity = resultStats.medianRate;
  return RVar25;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}